

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

FOTermFlattened * FOTermFlattened::variable(FOTermFlattened *__return_storage_ptr__,string *vname)

{
  bool bVar1;
  char *pcVar2;
  string *vname_local;
  FOTermFlattened *t;
  
  FOTermFlattened(__return_storage_ptr__);
  __return_storage_ptr__->tag = Variable;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)vname);
  bVar1 = false;
  if ('@' < *pcVar2) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)vname);
    bVar1 = *pcVar2 < '[';
  }
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)vname);
    return __return_storage_ptr__;
  }
  __assert_fail("vname[0] >= \'A\' && vname[0] <= \'Z\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x1b5,"static FOTermFlattened FOTermFlattened::variable(std::string)");
}

Assistant:

static FOTermFlattened variable(std::string vname) {
        FOTermFlattened t;
        t.tag = FOTermTag::Variable;
        // should be capital
        assert(vname[0] >= 'A' && vname[0] <= 'Z');
        t.name = vname;
        return t;
    }